

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_style_load_all_cursors(nk_context *ctx,nk_cursor *cursors)

{
  long lVar1;
  
  if (ctx != (nk_context *)0x0) {
    for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
      (ctx->style).cursors[lVar1] = cursors;
      cursors = cursors + 1;
    }
    (ctx->style).cursor_visible = 1;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x3a07,"void nk_style_load_all_cursors(struct nk_context *, struct nk_cursor *)");
}

Assistant:

NK_API void
nk_style_load_all_cursors(struct nk_context *ctx, struct nk_cursor *cursors)
{
    int i = 0;
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return;
    style = &ctx->style;
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        style->cursors[i] = &cursors[i];
    style->cursor_visible = nk_true;
}